

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Texture.cpp
# Opt level: O0

RenderableTextureT * __thiscall nite::Texture::draw(Texture *this,float x,float y,float angle)

{
  float fVar1;
  bool bVar2;
  reference pvVar3;
  RenderableTextureT *this_00;
  Color *pCVar4;
  Vec2 local_4c [2];
  RenderableTextureT *local_38;
  RenderableTextureT *obj;
  float local_28;
  float rh;
  float rw;
  float angle_local;
  float y_local;
  float x_local;
  Texture *this_local;
  
  if (0x7fffffff < (uint)this->objectId) {
    return (RenderableTextureT *)0x0;
  }
  rh = angle;
  rw = y;
  angle_local = x;
  _y_local = this;
  pvVar3 = std::vector<textureT,_std::allocator<textureT>_>::operator[]
                     (&textureList,(long)this->objectId);
  local_28 = (float)pvVar3->Width;
  pvVar3 = std::vector<textureT,_std::allocator<textureT>_>::operator[]
                     (&textureList,(long)this->objectId);
  obj._4_4_ = (float)pvVar3->Height;
  fVar1 = (this->region).w;
  pvVar3 = std::vector<textureT,_std::allocator<textureT>_>::operator[]
                     (&textureList,(long)this->objectId);
  if ((fVar1 == (float)pvVar3->Width) && (!NAN(fVar1) && !NAN((float)pvVar3->Width))) {
    fVar1 = (this->region).h;
    pvVar3 = std::vector<textureT,_std::allocator<textureT>_>::operator[]
                       (&textureList,(long)this->objectId);
    if ((fVar1 == (float)pvVar3->Height) && (!NAN(fVar1) && !NAN((float)pvVar3->Height)))
    goto LAB_0023fbb0;
  }
  local_28 = (this->region).w;
  obj._4_4_ = (this->region).h;
LAB_0023fbb0:
  bVar2 = isClippingOut(angle_local,rw,local_28,obj._4_4_,0.0,0.0);
  if ((!bVar2) || (bVar2 = isItOnBatch(), bVar2)) {
    this_00 = (RenderableTextureT *)operator_new(0x88);
    RenderableTextureT::RenderableTextureT(this_00);
    (this_00->size).x = local_28;
    (this_00->size).y = obj._4_4_;
    (this_00->super_Renderable).position.x = angle_local;
    (this_00->super_Renderable).position.y = rw;
    this_00->objectId = this->objectId;
    this_00->angle = rh;
    this_00->smooth = (bool)(this->smooth & 1);
    local_38 = this_00;
    Vec2::Vec2(local_4c,0.0,0.0);
    local_38->origin = local_4c[0];
    (local_38->super_Renderable).function = drawTexture;
    pCVar4 = getColor();
    fVar1 = pCVar4->g;
    (local_38->super_Renderable).color.r = pCVar4->r;
    (local_38->super_Renderable).color.g = fVar1;
    fVar1 = pCVar4->a;
    (local_38->super_Renderable).color.b = pCVar4->b;
    (local_38->super_Renderable).color.a = fVar1;
    fVar1 = (this->region).y;
    (local_38->region).x = (this->region).x;
    (local_38->region).y = fVar1;
    fVar1 = (this->region).h;
    (local_38->region).w = (this->region).w;
    (local_38->region).h = fVar1;
    local_38->scale = this->scale;
    addRenderList(&local_38->super_Renderable);
    this_local = (Texture *)local_38;
  }
  else {
    this_local = (Texture *)0x0;
  }
  return (RenderableTextureT *)this_local;
}

Assistant:

nite::RenderableTextureT * nite::Texture::draw(float x, float y, float angle){
	if(objectId <= -1) return NULL;
	float rw = textureList[objectId].Width;
	float rh = textureList[objectId].Height;
	if(region.w != textureList[objectId].Width || region.h !=textureList[objectId].Height){
		rw = region.w;
		rh = region.h;
	}
	if(isClippingOut(x, y, rw, rh, 0.0f, 0.0f) && !isItOnBatch()) return NULL;
	nite::RenderableTextureT *obj = new nite::RenderableTextureT();
	obj->size.x			= rw;
	obj->size.y 		= rh;
	obj->position.x 	= x;
	obj->position.y 	= y;
	obj->objectId			= objectId;
	obj->angle 			= angle;
	obj->smooth 		= smooth;
	obj->origin			= nite::Vec2(0, 0);
	obj->function		= &drawTexture;
	obj->color			= nite::getColor();
	obj->region			= region;
	obj->scale			= scale;
	nite::addRenderList((nite::Renderable*)obj);
	return obj;
}